

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

void anon_unknown.dwarf_7e3ca::ProbeCaptureDeviceList(void)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  char local_31;
  string names;
  
  names._M_dataplus._M_p = &local_31;
  plVar2 = (long *)__tls_get_addr(&PTR_001acf60);
  *plVar2 = (long)&names;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_001acf88);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&(anonymous_namespace)::alc_config_once,__once_proxy);
  if (iVar1 == 0) {
    *plVar2 = 0;
    *puVar3 = 0;
    std::recursive_mutex::lock((recursive_mutex *)(anonymous_namespace)::ListLock);
    if ((anonymous_namespace)::CaptureFactory == (long *)0x0) {
      names._M_dataplus._M_p = (pointer)&names.field_2;
      names._M_string_length = 0;
      names.field_2._M_local_buf[0] = '\0';
    }
    else {
      (**(code **)(*(anonymous_namespace)::CaptureFactory + 0x10))
                (&names,(anonymous_namespace)::CaptureFactory,1);
      if (names._M_string_length == 0) {
        std::__cxx11::string::push_back((char)&names);
      }
    }
    std::__cxx11::string::swap((string *)&names);
    std::__cxx11::string::~string((string *)&names);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ProbeCaptureDeviceList()
{
    DO_INITCONFIG();

    std::lock_guard<std::recursive_mutex> _{ListLock};
    if(!CaptureFactory)
        decltype(alcCaptureDeviceList){}.swap(alcCaptureDeviceList);
    else
    {
        std::string names{CaptureFactory->probe(BackendType::Capture)};
        if(names.empty()) names += '\0';
        names.swap(alcCaptureDeviceList);
    }